

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_front(void)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  initializer_list<int> input;
  circular_view<int,_4UL> span;
  int array [4];
  circular_view<int,_4UL> local_50;
  int local_34 [3];
  type local_28 [6];
  
  local_50.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_34[0] = 0xb;
  local_34[1] = 0x16;
  local_34[2] = 0x21;
  input._M_len = 3;
  input._M_array = local_34;
  vista::circular_view<int,_4UL>::assign(&local_50,input);
  if (local_50.member.size == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                  ,0x6f,"reference vista::circular_view<int, 4>::front() [T = int, Extent = 4]");
  }
  local_34[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x35d,"void api_fixed_suite::fixed_front()",
             (ulong)(((int)local_50.member.next - (int)local_50.member.size & 3U) << 2) +
             (long)local_50.member.data,local_34);
  uVar1 = (uint)local_50.member.next;
  uVar2 = uVar1 + 1;
  local_50.member.next = (ulong)(uVar2 & 3) | 4;
  sVar3 = local_50.member.size + 1;
  if (local_50.member.size == 4) {
    sVar3 = 4;
  }
  local_50.member.size = sVar3;
  if (sVar3 != 0) {
    local_50.member.data[uVar1 & 3] = 0x2c;
    local_34[0] = 0xb;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
              ("span.front()","11",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
               ,0x35f,"void api_fixed_suite::fixed_front()",
               local_50.member.data + (uVar2 - (int)sVar3 & 3),local_34);
    uVar1 = (uint)local_50.member.next;
    uVar2 = uVar1 + 1;
    local_50.member.next = (ulong)(uVar2 & 3) | 4;
    sVar3 = local_50.member.size + 1;
    if (local_50.member.size == 4) {
      sVar3 = 4;
    }
    local_50.member.size = sVar3;
    if (sVar3 != 0) {
      local_50.member.data[uVar1 & 3] = 0x37;
      local_34[0] = 0x16;
      boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
                ("span.front()","22",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
                 ,0x361,"void api_fixed_suite::fixed_front()",
                 local_50.member.data + (uVar2 - (int)sVar3 & 3),local_34);
      return;
    }
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x80,"reference vista::circular_view<int, 4>::back() [T = int, Extent = 4]");
}

Assistant:

void fixed_front()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(44);
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(55);
    BOOST_TEST_EQ(span.front(), 22);
}